

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CategoricalDistributionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_categoricaldistribution(NeuralNetworkLayer *this)

{
  bool bVar1;
  CategoricalDistributionLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_categoricaldistribution(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_categoricaldistribution(this);
    this_00 = (CategoricalDistributionLayerParams *)operator_new(0x30);
    CategoricalDistributionLayerParams::CategoricalDistributionLayerParams(this_00);
    (this->layer_).categoricaldistribution_ = this_00;
  }
  return (CategoricalDistributionLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CategoricalDistributionLayerParams* NeuralNetworkLayer::mutable_categoricaldistribution() {
  if (!has_categoricaldistribution()) {
    clear_layer();
    set_has_categoricaldistribution();
    layer_.categoricaldistribution_ = new ::CoreML::Specification::CategoricalDistributionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.categoricalDistribution)
  return layer_.categoricaldistribution_;
}